

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

bool duckdb::PushdownInternal
               (ClientContext *context,MultiFileOptions *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,vector<duckdb::LogicalType,_true> *types,
               vector<unsigned_long,_true> *column_ids,TableFilterSet *filters,
               vector<duckdb::OpenFileInfo,_true> *expanded_files)

{
  column_t column_id;
  bool bVar1;
  const_reference pvVar2;
  const_reference args;
  pointer pTVar3;
  type pBVar4;
  _Rb_tree_node_base *p_Var5;
  pointer *__ptr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  filter_expressions;
  MultiFilePushdownInfo info;
  ExtraOperatorInfo extra_info;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_f8;
  ColumnBinding local_f0;
  ClientContext *local_e0;
  MultiFileOptions *local_d8;
  vector<duckdb::LogicalType,_true> *local_d0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_c8;
  MultiFilePushdownInfo local_b0;
  ExtraOperatorInfo local_68;
  
  local_e0 = context;
  local_d8 = options;
  local_d0 = types;
  ExtraOperatorInfo::ExtraOperatorInfo(&local_68);
  MultiFilePushdownInfo::MultiFilePushdownInfo(&local_b0,0,names,column_ids,&local_68);
  local_c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var5 = (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(filters->filters)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
    pvVar2 = vector<unsigned_long,_true>::get<true>(column_ids,*(size_type *)(p_Var5 + 1));
    column_id = *pvVar2;
    bVar1 = IsVirtualColumn(column_id);
    if (!bVar1) {
      args = vector<duckdb::LogicalType,_true>::get<true>(local_d0,column_id);
      local_f0.column_index = *(idx_t *)(p_Var5 + 1);
      local_f0.table_index = 0;
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding>
                ((duckdb *)&local_f8,args,&local_f0);
      pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)&p_Var5[1]._M_parent);
      pBVar4 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
               ::operator*((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                            *)&local_f8);
      (*pTVar3->_vptr_TableFilter[6])(&local_f0,pTVar3,pBVar4);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_c8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_f0);
      if ((long *)local_f0.table_index != (long *)0x0) {
        (**(code **)(*(long *)local_f0.table_index + 8))();
      }
      if (local_f8._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*((local_f8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
    }
  }
  bVar1 = PushdownInternal(local_e0,local_d8,&local_b0,&local_c8,expanded_files);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_c8);
  MultiFilePushdownInfo::~MultiFilePushdownInfo(&local_b0);
  ExtraOperatorInfo::~ExtraOperatorInfo(&local_68);
  return bVar1;
}

Assistant:

bool PushdownInternal(ClientContext &context, const MultiFileOptions &options, const vector<string> &names,
                      const vector<LogicalType> &types, const vector<column_t> &column_ids,
                      const TableFilterSet &filters, vector<OpenFileInfo> &expanded_files) {
	idx_t table_index = 0;
	ExtraOperatorInfo extra_info;

	// construct the pushdown info
	MultiFilePushdownInfo info(table_index, names, column_ids, extra_info);

	// construct the set of expressions from the table filters
	vector<unique_ptr<Expression>> filter_expressions;
	for (auto &entry : filters.filters) {
		idx_t local_index = entry.first;
		idx_t column_idx = column_ids[local_index];
		if (IsVirtualColumn(column_idx)) {
			continue;
		}
		auto column_ref =
		    make_uniq<BoundColumnRefExpression>(types[column_idx], ColumnBinding(table_index, entry.first));
		auto filter_expr = entry.second->ToExpression(*column_ref);
		filter_expressions.push_back(std::move(filter_expr));
	}

	// call the original PushdownInternal method
	return PushdownInternal(context, options, info, filter_expressions, expanded_files);
}